

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyReadWireLoad(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  Scl_Item_t *pRoot;
  Scl_Item_t *pSVar7;
  double dVar8;
  
  iVar2 = Scl_LibertyItemNum(p,p->pItems,"wire_load");
  Vec_StrPutI_(vOut,iVar2);
  uVar1 = p->pItems->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if (-1 < (int)uVar1) {
      pRoot = p->pItems + uVar1;
      do {
        iVar4 = (pRoot->Key).Beg;
        iVar3 = (pRoot->Key).End - iVar4;
        iVar4 = strncmp(p->pContents + iVar4,"wire_load",(long)iVar3);
        if (iVar3 == 9 && iVar4 == 0) {
          pcVar5 = Scl_LibertyReadString(p,pRoot->Head);
          Vec_StrPutS_(vOut,pcVar5);
          uVar1 = pRoot->Child;
          uVar6 = (ulong)uVar1;
          iVar2 = p->nItems;
          if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
          if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar7 = p->pItems + uVar6;
            do {
              iVar4 = (pSVar7->Key).Beg;
              iVar3 = (pSVar7->Key).End - iVar4;
              iVar4 = strncmp(p->pContents + iVar4,"capacitance",(long)iVar3);
              if (iVar3 == 0xb && iVar4 == 0) {
                pcVar5 = Scl_LibertyReadString(p,pSVar7->Head);
                dVar8 = atof(pcVar5);
                Vec_StrPutF_(vOut,(float)dVar8);
                iVar2 = p->nItems;
              }
              uVar1 = pSVar7->Next;
              if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
            } while ((-1 < (int)uVar1) &&
                    (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
            uVar6 = (ulong)(uint)pRoot->Child;
          }
          if (iVar2 <= (int)uVar6) goto LAB_003e6a4b;
          if ((-1 < (int)uVar6) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar7 = p->pItems + uVar6;
            do {
              iVar4 = (pSVar7->Key).Beg;
              iVar3 = (pSVar7->Key).End - iVar4;
              iVar4 = strncmp(p->pContents + iVar4,"slope",(long)iVar3);
              if (iVar3 == 5 && iVar4 == 0) {
                pcVar5 = Scl_LibertyReadString(p,pSVar7->Head);
                dVar8 = atof(pcVar5);
                Vec_StrPutF_(vOut,(float)dVar8);
                iVar2 = p->nItems;
              }
              uVar1 = pSVar7->Next;
              if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
            } while ((-1 < (int)uVar1) &&
                    (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          }
          iVar2 = Scl_LibertyItemNum(p,pRoot,"fanout_length");
          Vec_StrPutI_(vOut,iVar2);
          uVar1 = pRoot->Child;
          iVar2 = p->nItems;
          if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
          if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar7 = p->pItems + uVar1;
            do {
              iVar4 = (pSVar7->Key).Beg;
              iVar3 = (pSVar7->Key).End - iVar4;
              iVar4 = strncmp(p->pContents + iVar4,"fanout_length",(long)iVar3);
              if (iVar3 == 0xd && iVar4 == 0) {
                pcVar5 = Scl_LibertyReadString(p,pSVar7->Head);
                pcVar5 = strtok(pcVar5," ,");
                iVar2 = atoi(pcVar5);
                pcVar5 = strtok((char *)0x0," ");
                dVar8 = atof(pcVar5);
                Vec_StrPutI_(vOut,iVar2);
                Vec_StrPutF_(vOut,(float)dVar8);
                iVar2 = p->nItems;
              }
              uVar1 = pSVar7->Next;
              if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
            } while ((-1 < (int)uVar1) &&
                    (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          }
        }
        uVar1 = pRoot->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003e6a4b;
      } while ((-1 < (int)uVar1) && (pRoot = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return;
  }
LAB_003e6a4b:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

void Scl_LibertyReadWireLoad( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Scl_ItemForEachChildName( p, pItem, pChild, "capacitance" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Scl_ItemForEachChildName( p, pItem, pChild, "slope" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "fanout_length") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "fanout_length" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            int    First  = atoi( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ") );
            Vec_StrPutI_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}